

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdma.cc
# Opt level: O0

void __thiscall bsplib::Rdma::pop_reg(Rdma *this,Memslot id)

{
  Memslot MVar1;
  Memblock *pMVar2;
  Memslot MVar3;
  bool bVar4;
  Memslot local_18;
  Memslot id_local;
  Rdma *this_local;
  
  local_18 = id;
  id_local = (Memslot)this;
  MVar1 = null_slot();
  bVar4 = true;
  if (id != MVar1) {
    pMVar2 = slot(this,this->m_pid,local_18);
    bVar4 = (pMVar2->status & 2) == 0;
  }
  MVar1 = local_18;
  if (!bVar4) {
    __assert_fail("id == null_slot() || !( slot(m_pid, id ).status & Memblock::POPPED)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/src/rdma.cc"
                  ,0x41,"void bsplib::Rdma::pop_reg(Memslot)");
  }
  MVar3 = null_slot();
  if (MVar1 != MVar3) {
    pMVar2 = slot(this,this->m_pid,local_18);
    pMVar2->status = pMVar2->status | 2;
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            (&(this->m_send_push_pop_comm_buf).m_popped_slots,&local_18);
  return;
}

Assistant:

void Rdma::pop_reg( Memslot id )
{
    assert( id == null_slot() || !( slot(m_pid, id ).status & Memblock::POPPED) );
    if ( id != null_slot() ) {
        slot( m_pid, id ).status |= Memblock::POPPED;
    }
    m_send_push_pop_comm_buf.m_popped_slots.push_back( id );
}